

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

ModportSymbol * __thiscall
slang::ast::InterfacePortSymbol::getModport
          (InterfacePortSymbol *this,ASTContext *context,InstanceSymbol *instance,
          DeferredSourceRange sourceRange)

{
  size_t sVar1;
  ModportSymbol *pMVar2;
  Diagnostic *this_00;
  DefinitionSymbol *pDVar3;
  string_view name;
  SourceRange sourceRange_00;
  
  sVar1 = (this->modport)._M_len;
  if (sVar1 != 0) {
    name._M_str = (this->modport)._M_str;
    name._M_len = sVar1;
    pMVar2 = (ModportSymbol *)Scope::find(&instance->body->super_Scope,name);
    if ((pMVar2 != (ModportSymbol *)0x0) && ((pMVar2->super_Symbol).kind == Modport)) {
      return pMVar2;
    }
    sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
    this_00 = ASTContext::addDiag(context,(DiagCode)0x22000a,sourceRange_00);
    Diagnostic::operator<<(this_00,this->modport);
    pDVar3 = InstanceSymbol::getDefinition(instance);
    Diagnostic::operator<<(this_00,(pDVar3->super_Symbol).name);
    Diagnostic::addNote(this_00,(DiagCode)0xd0001,(this->super_Symbol).location);
  }
  return (ModportSymbol *)0x0;
}

Assistant:

const ModportSymbol* InterfacePortSymbol::getModport(const ASTContext& context,
                                                     const InstanceSymbol& instance,
                                                     DeferredSourceRange sourceRange) const {
    if (modport.empty())
        return nullptr;

    auto sym = instance.body.find(modport);
    if (!sym || sym->kind != SymbolKind::Modport) {
        auto& diag = context.addDiag(diag::NotAModport, *sourceRange);
        diag << modport;
        diag << instance.getDefinition().name;
        diag.addNote(diag::NoteReferencedHere, location);
        return nullptr;
    }

    return &sym->as<ModportSymbol>();
}